

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

V5_TextDisplayMode ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(ON_DimStyle *V6_dim_style)

{
  TextOrientation TVar1;
  TextLocation TVar2;
  ContentAngleStyle CVar3;
  undefined1 local_1a;
  ON_DimStyle *V6_dim_style_local;
  
  TVar1 = ON_DimStyle::DimTextOrientation(V6_dim_style);
  if (TVar1 == InView) {
    V6_dim_style_local._7_1_ = kHorizontalToScreen;
  }
  else {
    TVar2 = ON_DimStyle::DimTextLocation(V6_dim_style);
    if (TVar2 == AboveDimLine) {
      V6_dim_style_local._7_1_ = kAboveLine;
    }
    else if (TVar2 == InDimLine) {
      CVar3 = ON_DimStyle::DimTextAngleStyle(V6_dim_style);
      local_1a = kHorizontalInCplane;
      if (CVar3 != Horizontal) {
        local_1a = kInLine;
      }
      V6_dim_style_local._7_1_ = local_1a;
    }
    else if (TVar2 == BelowDimLine) {
      V6_dim_style_local._7_1_ = kAboveLine;
    }
    else {
      V6_dim_style_local._7_1_ = kNormal;
    }
  }
  return V6_dim_style_local._7_1_;
}

Assistant:

ON_INTERNAL_OBSOLETE::V5_TextDisplayMode ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(
  const ON_DimStyle& V6_dim_style
)
{
  if (V6_dim_style.DimTextOrientation() == ON::TextOrientation::InView)
  {
    return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen;
  }

  switch (V6_dim_style.DimTextLocation())
  {
  case ON_DimStyle::TextLocation::AboveDimLine:
    return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    break;

  case ON_DimStyle::TextLocation::InDimLine:
    return (ON_DimStyle::ContentAngleStyle::Horizontal == V6_dim_style.DimTextAngleStyle() )
      ? ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalInCplane
      : ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
    break;

  case ON_DimStyle::TextLocation::BelowDimLine:
    return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    break;

  default:
    break;
  }

  return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
}